

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  pointer this_00;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  reference ppcVar5;
  cmMakefile *this_01;
  pointer pvVar6;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  char *pcVar7;
  reference ppcVar8;
  cmSourceGroup *this_02;
  pointer pcVar9;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x_00;
  reference ppcVar10;
  string *psVar11;
  char *local_2f8;
  string local_2a8;
  undefined1 local_288 [8];
  string linkName4;
  string fullPath;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_240;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_238;
  const_iterator fileIt;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_210;
  undefined1 local_1f0 [8];
  string linkName3;
  __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  local_1c8;
  iterator sgIt;
  cmSourceGroup *sourceGroup;
  string source;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_188;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_180;
  const_iterator sfIt;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  cmTarget *tgt;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_f0;
  char *local_d0;
  char *prefix;
  string linkName2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_a0;
  const_iterator ti;
  cmTargets *targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_80;
  const_iterator lgIt;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string linkName;
  cmGeneratedFileStream *fout_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  linkName.field_2._8_8_ = fout;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"[Targets]",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = linkName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"virtual:/virtual",(allocator *)((long)&lgIt._M_current + 7));
  AppendLinkedResource((cmGeneratedFileStream *)uVar1,(string *)local_38,&local_70,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lgIt._M_current + 7));
  pvVar4 = cmGlobalGenerator::GetLocalGenerators
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_80._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar4);
  while( true ) {
    pvVar4 = cmGlobalGenerator::GetLocalGenerators
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar4);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar2) break;
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_80);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar5);
    ti.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )cmMakefile::GetTargets_abi_cxx11_(this_01);
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)ti.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur);
    while( true ) {
      linkName2.field_2._8_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)ti.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur);
      bVar2 = std::__detail::operator!=
                        (&local_a0,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)((long)&linkName2.field_2 + 8));
      if (!bVar2) break;
      std::__cxx11::string::string((string *)&prefix,(string *)local_38);
      std::__cxx11::string::operator+=((string *)&prefix,"/");
      pvVar6 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_a0);
      TVar3 = cmTarget::GetType(&pvVar6->second);
      if (TVar3 < UTILITY) {
        pvVar6 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_a0);
        TVar3 = cmTarget::GetType(&pvVar6->second);
        if (TVar3 == EXECUTABLE) {
          local_2f8 = "[exe] ";
        }
        else {
          local_2f8 = "[lib] ";
        }
        local_d0 = local_2f8;
        std::__cxx11::string::operator+=((string *)&prefix,local_2f8);
        pvVar6 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_a0);
        std::__cxx11::string::operator+=((string *)&prefix,(string *)pvVar6);
        uVar1 = linkName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,"virtual:/virtual",
                   (allocator *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        AppendLinkedResource
                  ((cmGeneratedFileStream *)uVar1,(string *)&prefix,&local_f0,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        if ((this->GenerateLinkedResources & 1U) != 0) {
          __x = cmMakefile::GetSourceGroups(this_01);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&tgt,__x);
          pvVar6 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_a0);
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&pvVar6->second;
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_130);
          this_00 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_170,"CMAKE_BUILD_TYPE",
                     (allocator *)((long)&sfIt._M_current + 7));
          pcVar7 = cmMakefile::GetSafeDefinition(this_01,&local_170);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_150,pcVar7,(allocator *)((long)&sfIt._M_current + 6));
          cmTarget::GetSourceFiles
                    ((cmTarget *)this_00,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_130,&local_150
                    );
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 6));
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 7));
          local_188._M_current =
               (cmSourceFile **)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_130);
          __gnu_cxx::
          __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          ::__normal_iterator<cmSourceFile**>
                    ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                      *)&local_180,&local_188);
          while( true ) {
            source.field_2._8_8_ =
                 std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                           ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_130);
            bVar2 = __gnu_cxx::operator!=
                              (&local_180,
                               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                *)((long)&source.field_2 + 8));
            if (!bVar2) break;
            ppcVar8 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_180);
            psVar11 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
            std::__cxx11::string::string((string *)&sourceGroup,(string *)psVar11);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            this_02 = cmMakefile::FindSourceGroup
                                (this_01,pcVar7,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&tgt);
            ppcVar8 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_180);
            cmSourceGroup::AssignSource(this_02,*ppcVar8);
            std::__cxx11::string::~string((string *)&sourceGroup);
            sgIt._M_current =
                 (cmSourceGroup *)
                 __gnu_cxx::
                 __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                 ::operator++(&local_180,0);
          }
          local_1c8._M_current =
               (cmSourceGroup *)
               std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin
                         ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&tgt);
          while( true ) {
            linkName3.field_2._8_8_ =
                 std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end
                           ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&tgt);
            bVar2 = __gnu_cxx::operator!=
                              (&local_1c8,
                               (__normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                *)((long)&linkName3.field_2 + 8));
            if (!bVar2) break;
            std::__cxx11::string::string((string *)local_1f0,(string *)&prefix);
            std::__cxx11::string::operator+=((string *)local_1f0,"/");
            pcVar9 = __gnu_cxx::
                     __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                     ::operator->(&local_1c8);
            pcVar7 = cmSourceGroup::GetFullName(pcVar9);
            std::__cxx11::string::operator+=((string *)local_1f0,pcVar7);
            uVar1 = linkName.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_210,"virtual:/virtual",
                       (allocator *)
                       ((long)&sFiles.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            AppendLinkedResource
                      ((cmGeneratedFileStream *)uVar1,(string *)local_1f0,&local_210,VirtualFolder);
            std::__cxx11::string::~string((string *)&local_210);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&sFiles.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pcVar9 = __gnu_cxx::
                     __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                     ::operator->(&local_1c8);
            __x_00 = cmSourceGroup::GetSourceFiles(pcVar9);
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &fileIt,__x_00);
            local_240._M_current =
                 (cmSourceFile **)
                 std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                           ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &fileIt);
            __gnu_cxx::
            __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
            ::__normal_iterator<cmSourceFile_const**>
                      ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                        *)&local_238,&local_240);
            while( true ) {
              fullPath.field_2._8_8_ =
                   std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                             ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *
                              )&fileIt);
              bVar2 = __gnu_cxx::operator!=
                                (&local_238,
                                 (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                  *)((long)&fullPath.field_2 + 8));
              if (!bVar2) break;
              ppcVar10 = __gnu_cxx::
                         __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                         ::operator*(&local_238);
              psVar11 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar10);
              std::__cxx11::string::string
                        ((string *)(linkName4.field_2._M_local_buf + 8),(string *)psVar11);
              bVar2 = cmsys::SystemTools::FileIsDirectory((string *)((long)&linkName4.field_2 + 8));
              if (!bVar2) {
                std::__cxx11::string::string((string *)local_288,(string *)local_1f0);
                std::__cxx11::string::operator+=((string *)local_288,"/");
                cmsys::SystemTools::GetFilenameName
                          (&local_2a8,(string *)((long)&linkName4.field_2 + 8));
                std::__cxx11::string::operator+=((string *)local_288,(string *)&local_2a8);
                std::__cxx11::string::~string((string *)&local_2a8);
                AppendLinkedResource
                          ((cmGeneratedFileStream *)linkName.field_2._8_8_,(string *)local_288,
                           (string *)((long)&linkName4.field_2 + 8),LinkToFile);
                std::__cxx11::string::~string((string *)local_288);
              }
              std::__cxx11::string::~string((string *)(linkName4.field_2._M_local_buf + 8));
              __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator++(&local_238);
            }
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                      ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                       &fileIt);
            std::__cxx11::string::~string((string *)local_1f0);
            __gnu_cxx::
            __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
            ::operator++(&local_1c8);
          }
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_130);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&tgt);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_a0);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_80);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const cmTargets& targets = makefile->GetTargets();

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          const char* prefix = (ti->second.GetType()==cmTarget::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += ti->first;
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmTarget* tgt = const_cast<cmTarget*>(&ti->second);
          std::vector<cmSourceFile*> files;
          tgt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           fullPath, LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}